

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O2

void cmExtraEclipseCDT4Generator::AppendStorageScanners(cmXMLWriter *xml,cmMakefile *makefile)

{
  string *runActionCommand;
  string *psVar1;
  allocator<char> local_10c;
  allocator<char> local_10b;
  allocator<char> local_10a;
  allocator<char> local_109;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string compilerArgs;
  string arg1;
  string compiler;
  string local_88;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&compiler,"CMAKE_MAKE_PROGRAM",(allocator<char> *)&arg1);
  runActionCommand = cmMakefile::GetRequiredDefinition(makefile,&compiler);
  std::__cxx11::string::~string((string *)&compiler);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&arg1,"CMAKE_C_COMPILER",(allocator<char> *)&compilerArgs);
  psVar1 = cmMakefile::GetSafeDefinition(makefile,&arg1);
  std::__cxx11::string::string((string *)&compiler,(string *)psVar1);
  std::__cxx11::string::~string((string *)&arg1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&compilerArgs,"CMAKE_C_COMPILER_ARG1",(allocator<char> *)&local_108);
  psVar1 = cmMakefile::GetSafeDefinition(makefile,&compilerArgs);
  std::__cxx11::string::string((string *)&arg1,(string *)psVar1);
  std::__cxx11::string::~string((string *)&compilerArgs);
  if (compiler._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&compilerArgs,"CMAKE_CXX_COMPILER",(allocator<char> *)&local_108);
    cmMakefile::GetSafeDefinition(makefile,&compilerArgs);
    std::__cxx11::string::_M_assign((string *)&compiler);
    std::__cxx11::string::~string((string *)&compilerArgs);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&compilerArgs,"CMAKE_CXX_COMPILER_ARG1",(allocator<char> *)&local_108);
    cmMakefile::GetSafeDefinition(makefile,&compilerArgs);
    std::__cxx11::string::_M_assign((string *)&arg1);
    std::__cxx11::string::~string((string *)&compilerArgs);
    if (compiler._M_string_length == 0) {
      std::__cxx11::string::assign((char *)&compiler);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&compilerArgs,"-E -P -v -dD ${plugin_state_location}/${specs_file}",
             (allocator<char> *)&local_108);
  if (arg1._M_string_length != 0) {
    std::__cxx11::string::append((char *)&arg1);
    std::operator+(&local_108,&arg1,&compilerArgs);
    std::__cxx11::string::operator=((string *)&compilerArgs,(string *)&local_108);
    std::__cxx11::string::~string((string *)&local_108);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"storageModule",(allocator<char> *)&local_88);
  cmXMLWriter::StartElement(xml,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  cmXMLWriter::Attribute<char[21]>(xml,"moduleId",(char (*) [21])"scannerConfiguration");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"autodiscovery",(allocator<char> *)&local_88);
  cmXMLWriter::StartElement(xml,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  cmXMLWriter::Attribute<char[5]>(xml,"enabled",(char (*) [5])0x46dd29);
  cmXMLWriter::Attribute<char[5]>(xml,"problemReportingEnabled",(char (*) [5])0x46dd29);
  cmXMLWriter::Attribute<char[59]>
            (xml,"selectedProfileId",
             (char (*) [59])"org.eclipse.cdt.make.core.GCCStandardMakePerProjectProfile");
  cmXMLWriter::EndElement(xml);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"org.eclipse.cdt.make.core.GCCStandardMakePerProjectProfile",
             (allocator<char> *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"",&local_10b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"specsFile",&local_10c);
  AppendScannerProfile
            (xml,&local_108,true,&local_88,true,&local_68,&compilerArgs,&compiler,true,true);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"org.eclipse.cdt.make.core.GCCStandardMakePerFileProfile",
             &local_10b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"",&local_10c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"makefileGenerator",&local_109);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"-f ${project_name}_scd.mk",&local_10a);
  AppendScannerProfile
            (xml,&local_108,true,&local_88,true,&local_68,&local_48,runActionCommand,true,true);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_108);
  cmXMLWriter::EndElement(xml);
  std::__cxx11::string::~string((string *)&compilerArgs);
  std::__cxx11::string::~string((string *)&arg1);
  std::__cxx11::string::~string((string *)&compiler);
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::AppendStorageScanners(
  cmXMLWriter& xml, const cmMakefile& makefile)
{
  // we need the "make" and the C (or C++) compiler which are used, Alex
  const std::string& make =
    makefile.GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  std::string compiler = makefile.GetSafeDefinition("CMAKE_C_COMPILER");
  std::string arg1 = makefile.GetSafeDefinition("CMAKE_C_COMPILER_ARG1");
  if (compiler.empty()) {
    compiler = makefile.GetSafeDefinition("CMAKE_CXX_COMPILER");
    arg1 = makefile.GetSafeDefinition("CMAKE_CXX_COMPILER_ARG1");
  }
  if (compiler.empty()) // Hmm, what to do now ?
  {
    compiler = "gcc";
  }

  // the following right now hardcodes gcc behaviour :-/
  std::string compilerArgs =
    "-E -P -v -dD ${plugin_state_location}/${specs_file}";
  if (!arg1.empty()) {
    arg1 += " ";
    compilerArgs = arg1 + compilerArgs;
  }

  xml.StartElement("storageModule");
  xml.Attribute("moduleId", "scannerConfiguration");

  xml.StartElement("autodiscovery");
  xml.Attribute("enabled", "true");
  xml.Attribute("problemReportingEnabled", "true");
  xml.Attribute("selectedProfileId",
                "org.eclipse.cdt.make.core.GCCStandardMakePerProjectProfile");
  xml.EndElement(); // autodiscovery

  cmExtraEclipseCDT4Generator::AppendScannerProfile(
    xml, "org.eclipse.cdt.make.core.GCCStandardMakePerProjectProfile", true,
    "", true, "specsFile", compilerArgs, compiler, true, true);
  cmExtraEclipseCDT4Generator::AppendScannerProfile(
    xml, "org.eclipse.cdt.make.core.GCCStandardMakePerFileProfile", true, "",
    true, "makefileGenerator", "-f ${project_name}_scd.mk", make, true, true);

  xml.EndElement(); // storageModule
}